

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

string * spirv_cross::convert_to_string
                   (string *__return_storage_ptr__,int64_t value,string *int64_type,
                   bool long_long_literal_suffix)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  uint __len;
  ulong __val;
  string __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_001fb31e;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_001fb31e;
      }
      if (uVar5 < 10000) goto LAB_001fb31e;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      uVar3 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_001fb31e:
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(value >> 0x3f));
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50[0] + -(value >> 0x3f),__len,__val);
  plVar4 = (long *)::std::__cxx11::string::append((char *)local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string convert_to_string(int64_t value, const std::string &int64_type, bool long_long_literal_suffix)
{
	// INT64_MIN is ... special on some backends.
	// If we use a decimal literal, and negate it, we might overflow the representable numbers.
	// To workaround it, emit int(0x80000000) instead.
	if (value == std::numeric_limits<int64_t>::min())
		return join(int64_type, "(0x8000000000000000u", (long_long_literal_suffix ? "ll" : "l"), ")");
	else
		return std::to_string(value) + (long_long_literal_suffix ? "ll" : "l");
}